

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O0

String * __thiscall
kj::str<char_const(&)[2],char&,char_const(&)[19]>
          (String *__return_storage_ptr__,kj *this,char (*params) [2],char *params_1,
          char (*params_2) [19])

{
  char (*value) [2];
  char *value_00;
  char (*value_01) [19];
  ArrayPtr<const_char> local_50;
  char local_39 [1];
  ArrayPtr<const_char> local_38;
  char (*local_28) [19];
  char (*params_local_2) [19];
  char *params_local_1;
  char (*params_local) [2];
  
  local_28 = (char (*) [19])params_1;
  params_local_2 = (char (*) [19])params;
  params_local_1 = (char *)this;
  params_local = (char (*) [2])__return_storage_ptr__;
  value = ::const((char (*) [2])this);
  local_38 = toCharSequence<char_const(&)[2]>(value);
  value_00 = fwd<char&>(*params_local_2);
  local_39[0] = (char)toCharSequence<char&>(value_00);
  value_01 = ::const(local_28);
  local_50 = toCharSequence<char_const(&)[19]>(value_01);
  _::concat<kj::ArrayPtr<char_const>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>>
            (__return_storage_ptr__,(_ *)&local_38,(ArrayPtr<const_char> *)local_39,
             (FixedArray<char,_1UL> *)&local_50,(ArrayPtr<const_char> *)params_2);
  return __return_storage_ptr__;
}

Assistant:

String str(Params&&... params) {
  // Magic function which builds a string from a bunch of arbitrary values.  Example:
  //     str(1, " / ", 2, " = ", 0.5)
  // returns:
  //     "1 / 2 = 0.5"
  // To teach `str` how to stringify a type, see `Stringifier`.

  return _::concat(toCharSequence(kj::fwd<Params>(params))...);
}